

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O0

void __thiscall QPDF_String::writeJSON(QPDF_String *this,int json_version,Writer *p)

{
  bool bVar1;
  __type_conflict1 _Var2;
  Writer *pWVar3;
  string local_138;
  string_view local_118;
  string local_108;
  string_view local_e8;
  undefined1 local_d8 [8];
  string test;
  string local_b0;
  string_view local_90;
  string local_80;
  string_view local_60;
  undefined1 local_40 [8];
  string candidate;
  Writer *p_local;
  int json_version_local;
  QPDF_String *this_local;
  
  candidate.field_2._8_8_ = p;
  getUTF8Val_abi_cxx11_((string *)local_40,this);
  if (json_version == 1) {
    pWVar3 = JSON::Writer::operator<<((Writer *)candidate.field_2._8_8_,"\"");
    JSON::Writer::encode_string(&local_80,(string *)local_40);
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_80);
    pWVar3 = JSON::Writer::operator<<(pWVar3,local_60);
    JSON::Writer::operator<<(pWVar3,"\"");
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    bVar1 = QUtil::is_utf16(&this->val);
    if ((bVar1) || (bVar1 = QUtil::is_explicit_utf8(&this->val), bVar1)) {
      pWVar3 = JSON::Writer::operator<<((Writer *)candidate.field_2._8_8_,"\"u:");
      JSON::Writer::encode_string(&local_b0,(string *)local_40);
      local_90 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
      pWVar3 = JSON::Writer::operator<<(pWVar3,local_90);
      JSON::Writer::operator<<(pWVar3,"\"");
      std::__cxx11::string::~string((string *)&local_b0);
      test.field_2._12_4_ = 1;
      goto LAB_00348833;
    }
    bVar1 = useHexString(this);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_d8);
      bVar1 = QUtil::utf8_to_pdf_doc((string *)local_40,(string *)local_d8,'?');
      if ((bVar1) &&
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8,&this->val), _Var2)) {
        pWVar3 = JSON::Writer::operator<<((Writer *)candidate.field_2._8_8_,"\"u:");
        JSON::Writer::encode_string(&local_108,(string *)local_40);
        local_e8 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
        pWVar3 = JSON::Writer::operator<<(pWVar3,local_e8);
        JSON::Writer::operator<<(pWVar3,"\"");
        std::__cxx11::string::~string((string *)&local_108);
        test.field_2._12_4_ = 1;
      }
      else {
        test.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_d8);
      if (test.field_2._12_4_ != 0) goto LAB_00348833;
    }
    pWVar3 = JSON::Writer::operator<<((Writer *)candidate.field_2._8_8_,"\"b:");
    QUtil::hex_encode(&local_138,&this->val);
    local_118 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_138);
    pWVar3 = JSON::Writer::operator<<(pWVar3,local_118);
    JSON::Writer::operator<<(pWVar3,"\"");
    std::__cxx11::string::~string((string *)&local_138);
  }
  test.field_2._12_4_ = 0;
LAB_00348833:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
QPDF_String::writeJSON(int json_version, JSON::Writer& p)
{
    auto candidate = getUTF8Val();
    if (json_version == 1) {
        p << "\"" << JSON::Writer::encode_string(candidate) << "\"";
    } else {
        // See if we can unambiguously represent as Unicode.
        if (QUtil::is_utf16(this->val) || QUtil::is_explicit_utf8(this->val)) {
            p << "\"u:" << JSON::Writer::encode_string(candidate) << "\"";
            return;
        } else if (!useHexString()) {
            std::string test;
            if (QUtil::utf8_to_pdf_doc(candidate, test, '?') && (test == this->val)) {
                // This is a PDF-doc string that can be losslessly encoded as Unicode.
                p << "\"u:" << JSON::Writer::encode_string(candidate) << "\"";
                return;
            }
        }
        p << "\"b:" << QUtil::hex_encode(val) << "\"";
    }
}